

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O1

lzma_ret simple_code(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                    size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  size_t *in_pos_00;
  size_t *out_pos_00;
  uint8_t *out_00;
  size_t sVar1;
  lzma_ret lVar2;
  long lVar3;
  undefined8 uVar4;
  size_t __n;
  ulong __n_00;
  long lVar5;
  
  if (action == LZMA_SYNC_FLUSH) {
    return LZMA_OPTIONS_ERROR;
  }
  in_pos_00 = (size_t *)((long)coder_ptr + 0x70);
  if (*(ulong *)((long)coder_ptr + 0x70) < *(ulong *)((long)coder_ptr + 0x78)) {
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0x88),in_pos_00,*(ulong *)((long)coder_ptr + 0x78),out
                ,out_pos,out_size);
    if (*(ulong *)((long)coder_ptr + 0x70) < *(ulong *)((long)coder_ptr + 0x78)) {
      return LZMA_OK;
    }
    if (*(char *)((long)coder_ptr + 0x48) == '\x01') {
      if (*(ulong *)((long)coder_ptr + 0x78) == *(ulong *)((long)coder_ptr + 0x80)) {
        return LZMA_STREAM_END;
      }
      __assert_fail("coder->filtered == coder->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0x5f,
                    "lzma_ret simple_code(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
  }
  *(undefined8 *)((long)coder_ptr + 0x78) = 0;
  if (*(char *)((long)coder_ptr + 0x48) == '\x01') {
    __assert_fail("!coder->end_was_reached",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                  ,0x67,
                  "lzma_ret simple_code(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  sVar1 = *out_pos;
  out_pos_00 = (size_t *)((long)coder_ptr + 0x80);
  lVar3 = *(long *)((long)coder_ptr + 0x70);
  __n_00 = *(long *)((long)coder_ptr + 0x80) - lVar3;
  if (__n_00 == 0 || __n_00 < out_size - sVar1) {
    if (*(long *)((long)coder_ptr + 0x80) != lVar3) {
      memcpy(out + sVar1,(void *)((long)coder_ptr + lVar3 + 0x88),__n_00);
    }
    *out_pos = __n_00 + sVar1;
    lVar2 = copy_or_code((lzma_simple_coder *)coder_ptr,allocator,in,in_pos,in_size,out,out_pos,
                         out_size,action);
    if (lVar2 != LZMA_OK) {
      if (lVar2 != LZMA_STREAM_END) {
        return lVar2;
      }
      __assert_fail("ret != LZMA_STREAM_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0x89,
                    "lzma_ret simple_code(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    lVar5 = *out_pos - sVar1;
    lVar3 = (**(code **)((long)coder_ptr + 0x50))
                      (*(undefined8 *)((long)coder_ptr + 0x58),
                       *(undefined4 *)((long)coder_ptr + 0x60),
                       *(undefined1 *)((long)coder_ptr + 0x49),out + sVar1,lVar5);
    *(int *)((long)coder_ptr + 0x60) = *(int *)((long)coder_ptr + 0x60) + (int)lVar3;
    __n = lVar5 - lVar3;
    if (*(ulong *)((long)coder_ptr + 0x68) >> 1 < __n) {
      __assert_fail("unfiltered <= coder->allocated / 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0x94,
                    "lzma_ret simple_code(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    *(undefined8 *)((long)coder_ptr + 0x70) = 0;
    *(size_t *)((long)coder_ptr + 0x80) = __n;
    if (*(char *)((long)coder_ptr + 0x48) == '\x01') {
      *out_pos_00 = 0;
    }
    else if (lVar5 != lVar3) {
      sVar1 = *out_pos;
      *out_pos = sVar1 - __n;
      memcpy((void *)((long)coder_ptr + 0x88),out + (sVar1 - __n),__n);
    }
  }
  else if (lVar3 != 0) {
    memmove((void *)((long)coder_ptr + 0x88),(void *)((long)coder_ptr + lVar3 + 0x88),__n_00);
    *(ulong *)((long)coder_ptr + 0x80) = __n_00;
    *(undefined8 *)((long)coder_ptr + 0x70) = 0;
  }
  if (*in_pos_00 != 0) {
    __assert_fail("coder->pos == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                  ,0xac,
                  "lzma_ret simple_code(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  if (*out_pos_00 != 0) {
    out_00 = (uint8_t *)((long)coder_ptr + 0x88);
    lVar2 = copy_or_code((lzma_simple_coder *)coder_ptr,allocator,in,in_pos,in_size,out_00,
                         out_pos_00,*(size_t *)((long)coder_ptr + 0x68),action);
    if (lVar2 == LZMA_STREAM_END) {
      __assert_fail("ret != LZMA_STREAM_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0xb8,
                    "lzma_ret simple_code(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    if (lVar2 != LZMA_OK) {
      return lVar2;
    }
    uVar4 = (**(code **)((long)coder_ptr + 0x50))
                      (*(undefined8 *)((long)coder_ptr + 0x58),
                       *(undefined4 *)((long)coder_ptr + 0x60),
                       *(undefined1 *)((long)coder_ptr + 0x49),out_00,
                       *(undefined8 *)((long)coder_ptr + 0x80));
    *(int *)((long)coder_ptr + 0x60) = *(int *)((long)coder_ptr + 0x60) + (int)uVar4;
    *(undefined8 *)((long)coder_ptr + 0x78) = uVar4;
    if (*(char *)((long)coder_ptr + 0x48) == '\x01') {
      *(undefined8 *)((long)coder_ptr + 0x78) = *(undefined8 *)((long)coder_ptr + 0x80);
    }
    lzma_bufcpy(out_00,in_pos_00,*(size_t *)((long)coder_ptr + 0x78),out,out_pos,out_size);
  }
  if ((*(char *)((long)coder_ptr + 0x48) != '\x01') ||
     (lVar2 = LZMA_STREAM_END, *in_pos_00 != *out_pos_00)) {
    lVar2 = LZMA_OK;
  }
  return lVar2;
}

Assistant:

static lzma_ret
simple_code(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_simple_coder *coder = coder_ptr;

	// TODO: Add partial support for LZMA_SYNC_FLUSH. We can support it
	// in cases when the filter is able to filter everything. With most
	// simple filters it can be done at offset that is a multiple of 2,
	// 4, or 16. With x86 filter, it needs good luck, and thus cannot
	// be made to work predictably.
	if (action == LZMA_SYNC_FLUSH)
		return LZMA_OPTIONS_ERROR;

	// Flush already filtered data from coder->buffer[] to out[].
	if (coder->pos < coder->filtered) {
		lzma_bufcpy(coder->buffer, &coder->pos, coder->filtered,
				out, out_pos, out_size);

		// If we couldn't flush all the filtered data, return to
		// application immediately.
		if (coder->pos < coder->filtered)
			return LZMA_OK;

		if (coder->end_was_reached) {
			assert(coder->filtered == coder->size);
			return LZMA_STREAM_END;
		}
	}

	// If we get here, there is no filtered data left in the buffer.
	coder->filtered = 0;

	assert(!coder->end_was_reached);

	// If there is more output space left than there is unfiltered data
	// in coder->buffer[], flush coder->buffer[] to out[], and copy/code
	// more data to out[] hopefully filling it completely. Then filter
	// the data in out[]. This step is where most of the data gets
	// filtered if the buffer sizes used by the application are reasonable.
	const size_t out_avail = out_size - *out_pos;
	const size_t buf_avail = coder->size - coder->pos;
	if (out_avail > buf_avail || buf_avail == 0) {
		// Store the old position so that we know from which byte
		// to start filtering.
		const size_t out_start = *out_pos;

		// Flush data from coder->buffer[] to out[], but don't reset
		// coder->pos and coder->size yet. This way the coder can be
		// restarted if the next filter in the chain returns e.g.
		// LZMA_MEM_ERROR.
		//
		// Do the memcpy() conditionally because out can be NULL
		// (in which case buf_avail is always 0). Calling memcpy()
		// with a null-pointer is undefined even if the third
		// argument is 0.
		if (buf_avail > 0)
			memcpy(out + *out_pos, coder->buffer + coder->pos,
					buf_avail);

		*out_pos += buf_avail;

		// Copy/Encode/Decode more data to out[].
		{
			const lzma_ret ret = copy_or_code(coder, allocator,
					in, in_pos, in_size,
					out, out_pos, out_size, action);
			assert(ret != LZMA_STREAM_END);
			if (ret != LZMA_OK)
				return ret;
		}

		// Filter out[].
		const size_t size = *out_pos - out_start;
		const size_t filtered = call_filter(
				coder, out + out_start, size);

		const size_t unfiltered = size - filtered;
		assert(unfiltered <= coder->allocated / 2);

		// Now we can update coder->pos and coder->size, because
		// the next coder in the chain (if any) was successful.
		coder->pos = 0;
		coder->size = unfiltered;

		if (coder->end_was_reached) {
			// The last byte has been copied to out[] already.
			// They are left as is.
			coder->size = 0;

		} else if (unfiltered > 0) {
			// There is unfiltered data left in out[]. Copy it to
			// coder->buffer[] and rewind *out_pos appropriately.
			*out_pos -= unfiltered;
			memcpy(coder->buffer, out + *out_pos, unfiltered);
		}
	} else if (coder->pos > 0) {
		memmove(coder->buffer, coder->buffer + coder->pos, buf_avail);
		coder->size -= coder->pos;
		coder->pos = 0;
	}

	assert(coder->pos == 0);

	// If coder->buffer[] isn't empty, try to fill it by copying/decoding
	// more data. Then filter coder->buffer[] and copy the successfully
	// filtered data to out[]. It is probable, that some filtered and
	// unfiltered data will be left to coder->buffer[].
	if (coder->size > 0) {
		{
			const lzma_ret ret = copy_or_code(coder, allocator,
					in, in_pos, in_size,
					coder->buffer, &coder->size,
					coder->allocated, action);
			assert(ret != LZMA_STREAM_END);
			if (ret != LZMA_OK)
				return ret;
		}

		coder->filtered = call_filter(
				coder, coder->buffer, coder->size);

		// Everything is considered to be filtered if coder->buffer[]
		// contains the last bytes of the data.
		if (coder->end_was_reached)
			coder->filtered = coder->size;

		// Flush as much as possible.
		lzma_bufcpy(coder->buffer, &coder->pos, coder->filtered,
				out, out_pos, out_size);
	}

	// Check if we got everything done.
	if (coder->end_was_reached && coder->pos == coder->size)
		return LZMA_STREAM_END;

	return LZMA_OK;
}